

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

player_shape * player_shape_by_idx(wchar_t index)

{
  player_shape *local_20;
  player_shape *shape;
  wchar_t index_local;
  
  local_20 = shapes;
  while( true ) {
    if (local_20 == (player_shape *)0x0) {
      msg("Could not find shape %d!",(ulong)(uint)index);
      return (player_shape *)0x0;
    }
    if (local_20->sidx == index) break;
    local_20 = local_20->next;
  }
  return local_20;
}

Assistant:

struct player_shape *player_shape_by_idx(int index)
{
	struct player_shape *shape = shapes;
	while (shape) {
		if (shape->sidx == index) {
			return shape;
		}
		shape = shape->next;
	}
	msg("Could not find shape %d!", index);
	return NULL;
}